

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dspsubrs.c
# Opt level: O2

void DSP_showdisplay(LispPTR *args)

{
  DisplayInitialized = (uint)(*args != 0);
  return;
}

Assistant:

void DSP_showdisplay(LispPTR *args)
{
  LispPTR base = args[0];   /* pointer to the display bitmap */
  LispPTR rasterwidth = args[1];  /* should be a smallp */

  if (base == NIL) {
    DisplayInitialized = 0;
  } else {
    DisplayInitialized = 1;
  }
}